

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

size_t google::protobuf::internal::WireFormatLite::SInt64Size(RepeatedField<long> *value)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  ulong uVar4;
  int index;
  size_t sVar5;
  
  iVar1 = value->current_size_;
  index = 0;
  if (iVar1 < 1) {
    sVar5 = 0;
  }
  else {
    sVar5 = 0;
    do {
      plVar3 = RepeatedField<long>::Get(value,index);
      uVar4 = *plVar3 >> 0x3f ^ *plVar3 * 2 | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar2 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (iVar1 != index);
  }
  return sVar5;
}

Assistant:

size_t WireFormatLite::SInt64Size(const RepeatedField<int64>& value) {
  size_t out = 0;
  const int n = value.size();
  for (int i = 0; i < n; i++) {
    out += SInt64Size(value.Get(i));
  }
  return out;
}